

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SqlGenerator.cpp
# Opt level: O2

void __thiscall SqlGenerator::~SqlGenerator(SqlGenerator *this)

{
  (this->super_CodeGenerator)._vptr_CodeGenerator = (_func_int **)&PTR__SqlGenerator_0021ecc0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_app).super___shared_ptr<Application,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&this->_outputDirectory);
  std::__cxx11::string::~string((string *)&this->_pathToData);
  return;
}

Assistant:

SqlGenerator::~SqlGenerator()
{
}